

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdUnblindTxOutData(void *handle,char *blinding_key,char *locking_script,char *asset_commitment,
                       char *value_commitment,char *commitment_nonce,char *rangeproof,char **asset,
                       int64_t *amount,char **asset_blind_factor,char **value_blind_factor)

{
  char *pcVar1;
  bool bVar2;
  int64_t iVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_R8;
  char *in_R9;
  Amount AVar4;
  char *in_stack_00000008;
  undefined8 *in_stack_00000010;
  int64_t *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  CfdException *except;
  exception *std_except;
  UnblindParameter unblind_data;
  ConfidentialTxOut txout;
  Privkey blinding_key_obj;
  ByteData rangeproof_obj;
  ConfidentialNonce nonce;
  ConfidentialValue value;
  ConfidentialAssetId asset_obj;
  Script locking_script_obj;
  char *work_value_blinder;
  char *work_asset_blinder;
  char *work_asset;
  int result;
  UnblindParameter *in_stack_fffffffffffff9b0;
  string *in_stack_fffffffffffffa10;
  CfdSourceLocation *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa38;
  allocator *paVar5;
  char *in_stack_fffffffffffffa40;
  Amount local_530;
  string local_520;
  string local_500;
  string local_4e0;
  UnblindParameter local_4c0;
  ByteData local_430;
  ConfidentialTxOut local_418;
  byte local_31b;
  byte local_31a;
  allocator local_319;
  string local_318;
  byte local_2f3;
  byte local_2f2;
  string local_2f1;
  allocator local_2c9;
  string local_2c8;
  Privkey local_2a8;
  allocator local_281;
  string local_280;
  ByteData local_260;
  allocator local_241;
  string local_240;
  ConfidentialNonce local_220;
  allocator local_1f1;
  string local_1f0;
  ConfidentialValue local_1d0;
  allocator local_1a1;
  string local_1a0;
  ConfidentialAssetId local_180;
  allocator local_151;
  string local_150;
  Script local_130;
  char *local_f8;
  undefined4 local_f0;
  char *local_e8;
  char *local_e0;
  undefined4 local_d8;
  char *local_d0;
  char *local_c8;
  undefined4 local_c0;
  char *local_b8;
  char *local_b0;
  undefined4 local_a8;
  char *local_a0;
  char *local_98;
  undefined4 local_90;
  char *local_88;
  char *local_80;
  undefined4 local_78;
  char *local_70;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  local_80 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_80 = local_80 + 1;
  local_78 = 0xc28;
  local_70 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  local_98 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_98 = local_98 + 1;
  local_90 = 0xc29;
  local_88 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  local_b0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_b0 = local_b0 + 1;
  local_a8 = 0xc2a;
  local_a0 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  local_c8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_c8 = local_c8 + 1;
  local_c0 = 0xc2b;
  local_b8 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  local_e0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_e0 = local_e0 + 1;
  local_d8 = 0xc2c;
  local_d0 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  local_f8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
  local_f8 = local_f8 + 1;
  local_f0 = 0xc2d;
  local_e8 = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,local_20,&local_151);
  cfd::core::Script::Script(&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,local_28,&local_1a1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,local_30,&local_1f1);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,local_38,&local_241);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  paVar5 = &local_281;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,in_stack_00000008,paVar5);
  cfd::core::ByteData::ByteData(&local_260,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  local_2f2 = 0;
  local_2f3 = 0;
  local_31a = 0;
  local_31b = 0;
  std::__cxx11::string::string((string *)&local_2c8,pcVar1,&local_2c9);
  bVar2 = cfd::core::Privkey::HasWif(&local_2c8,(NetType *)0x0,(bool *)0x0);
  if (bVar2) {
    in_stack_fffffffffffffa10 = &local_2f1;
    std::allocator<char>::allocator();
    local_2f2 = 1;
    std::__cxx11::string::string
              ((string *)&local_2f1.field_0x1,local_18,(allocator *)in_stack_fffffffffffffa10);
    local_2f3 = 1;
    cfd::core::Privkey::FromWif(&local_2a8,(string *)&local_2f1.field_0x1,kCustomChain,true);
  }
  else {
    std::allocator<char>::allocator();
    local_31a = 1;
    std::__cxx11::string::string((string *)&local_318,local_18,&local_319);
    local_31b = 1;
    cfd::core::Privkey::Privkey(&local_2a8,&local_318,kMainnet,true);
  }
  if ((local_31b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((local_31a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
  }
  if ((local_2f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2f1.field_0x1);
  }
  if ((local_2f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  cfd::core::ByteData::ByteData(&local_430);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_418,&local_130,&local_180,&local_1d0,&local_220,&local_430,&local_260);
  cfd::core::ByteData::~ByteData((ByteData *)0x5c4b6a);
  cfd::core::ConfidentialTxOut::Unblind(&local_4c0,&local_418,&local_2a8);
  if (in_stack_00000010 != (undefined8 *)0x0) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4e0,&local_4c0.asset);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffffa10);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_500,&local_4c0.abf);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffffa10);
    std::__cxx11::string::~string((string *)&local_500);
  }
  if (in_stack_00000028 != (undefined8 *)0x0) {
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_520,&local_4c0.vbf);
    local_58 = cfd::capi::CreateString(in_stack_fffffffffffffa10);
    std::__cxx11::string::~string((string *)&local_520);
  }
  if (in_stack_00000018 != (int64_t *)0x0) {
    AVar4 = cfd::core::ConfidentialValue::GetAmount(&local_4c0.value);
    local_530.amount_ = AVar4.amount_;
    local_530.ignore_check_ = AVar4.ignore_check_;
    iVar3 = cfd::core::Amount::GetSatoshiValue(&local_530);
    *in_stack_00000018 = iVar3;
  }
  if (in_stack_00000010 != (undefined8 *)0x0) {
    *in_stack_00000010 = local_48;
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    *in_stack_00000020 = local_50;
  }
  if (in_stack_00000028 != (undefined8 *)0x0) {
    *in_stack_00000028 = local_58;
  }
  local_4 = 0;
  cfd::core::UnblindParameter::~UnblindParameter(in_stack_fffffffffffff9b0);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_418);
  cfd::core::Privkey::~Privkey((Privkey *)0x5c510e);
  cfd::core::ByteData::~ByteData((ByteData *)0x5c511b);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5c5128);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5c5135);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5c5142);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff9b0);
  return local_4;
}

Assistant:

int CfdUnblindTxOutData(
    void* handle, const char* blinding_key, const char* locking_script,
    const char* asset_commitment, const char* value_commitment,
    const char* commitment_nonce, const char* rangeproof, char** asset,
    int64_t* amount, char** asset_blind_factor, char** value_blind_factor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blinder = nullptr;
  char* work_value_blinder = nullptr;
  try {
    cfd::Initialize();
    CheckEmptyString(locking_script, "locking_script", CFD_LOG_SOURCE);
    CheckEmptyString(asset_commitment, "asset", CFD_LOG_SOURCE);
    CheckEmptyString(value_commitment, "value_commitment", CFD_LOG_SOURCE);
    CheckEmptyString(commitment_nonce, "commitment_nonce", CFD_LOG_SOURCE);
    CheckEmptyString(rangeproof, "rangeproof", CFD_LOG_SOURCE);
    CheckEmptyString(blinding_key, "blinding_key", CFD_LOG_SOURCE);

    Script locking_script_obj(locking_script);
    ConfidentialAssetId asset_obj(asset_commitment);
    ConfidentialValue value(value_commitment);
    ConfidentialNonce nonce(commitment_nonce);
    ByteData rangeproof_obj(rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(blinding_key)
                                   ? Privkey::FromWif(blinding_key)
                                   : Privkey(blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    if (asset != nullptr) {
      work_asset = CreateString(unblind_data.asset.GetHex());
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blinder = CreateString(unblind_data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blinder = CreateString(unblind_data.vbf.GetHex());
    }
    if (amount != nullptr) {
      *amount = unblind_data.value.GetAmount().GetSatoshiValue();
    }

    if (asset != nullptr) *asset = work_asset;
    if (asset_blind_factor != nullptr) {
      *asset_blind_factor = work_asset_blinder;
    }
    if (value_blind_factor != nullptr) {
      *value_blind_factor = work_value_blinder;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blinder, &work_value_blinder);
  return result;
}